

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.cpp
# Opt level: O2

void __thiscall llvm::yaml::Output::paddedKey(Output *this,StringRef key)

{
  size_t sVar1;
  char *__s;
  StringRef s;
  
  output(this,key);
  sVar1 = 1;
  s.Length = 1;
  s.Data = ":";
  output(this,s);
  if (key.Length < 0x10) {
    __s = "                " + key.Length;
    sVar1 = strlen(__s);
  }
  else {
    __s = " ";
  }
  (this->Padding).Data = __s;
  (this->Padding).Length = sVar1;
  return;
}

Assistant:

void Output::paddedKey(StringRef key) {
  output(key);
  output(":");
  const char *spaces = "                ";
  if (key.size() < strlen(spaces))
    Padding = &spaces[key.size()];
  else
    Padding = " ";
}